

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11Platform.cpp
# Opt level: O2

void __thiscall tcu::x11::X11Platform::X11Platform(X11Platform *this)

{
  EventState *this_00;
  X11GLPlatform *this_01;
  ContextFactory *pCVar1;
  UniqueBase<glu::ContextFactory,_de::DefaultDeleter<glu::ContextFactory>_> local_48;
  UniqueBase<glu::ContextFactory,_de::DefaultDeleter<glu::ContextFactory>_> local_38;
  
  Platform::Platform(&this->super_Platform);
  (this->super_Platform)._vptr_Platform = (_func_int **)&PTR__X11Platform_00c07090;
  this_00 = &this->m_eventState;
  EventState::EventState(this_00);
  VulkanPlatform::VulkanPlatform(&this->m_vkPlatform,this_00);
  x11::egl::Platform::Platform(&this->m_eglPlatform,this_00);
  this_01 = &this->m_glPlatform;
  glu::Platform::Platform(&this_01->super_Platform);
  glx::createContextFactory
            ((MovePtr<glu::ContextFactory,_de::DefaultDeleter<glu::ContextFactory>_> *)&local_38,
             this_00);
  pCVar1 = local_38.m_data.ptr;
  local_38.m_data.ptr = (ContextFactory *)0x0;
  GenericFactoryRegistry::registerFactory
            ((GenericFactoryRegistry *)this_01,(AbstractFactory *)pCVar1);
  de::details::UniqueBase<glu::ContextFactory,_de::DefaultDeleter<glu::ContextFactory>_>::
  ~UniqueBase(&local_38);
  x11::egl::Platform::createContextFactory
            ((MovePtr<glu::ContextFactory,_de::DefaultDeleter<glu::ContextFactory>_> *)&local_48,
             &this->m_eglPlatform);
  pCVar1 = local_48.m_data.ptr;
  local_48.m_data.ptr = (ContextFactory *)0x0;
  GenericFactoryRegistry::registerFactory
            ((GenericFactoryRegistry *)this_01,(AbstractFactory *)pCVar1);
  de::details::UniqueBase<glu::ContextFactory,_de::DefaultDeleter<glu::ContextFactory>_>::
  ~UniqueBase(&local_48);
  return;
}

Assistant:

X11Platform::X11Platform (void)
	: m_vkPlatform	(m_eventState)
	, m_eglPlatform	(m_eventState)
{
#if defined (DEQP_SUPPORT_GLX)
	m_glPlatform.registerFactory(glx::createContextFactory(m_eventState));
#endif // DEQP_SUPPORT_GLX

	m_glPlatform.registerFactory(m_eglPlatform.createContextFactory());
}